

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

RunnerContext * RunBinary(Runner *runner)

{
  Token op_00;
  ASTNode *pAVar1;
  ASTNode *pAVar2;
  RunnerContext *pRVar3;
  RunnerContext *right_00;
  RunnerContext *rightContext;
  RunnerContext *leftContext;
  Token op;
  ASTNode *right;
  ASTNode *left;
  ASTNode *binary;
  Runner *runner_local;
  
  pAVar1 = runner->currentNode;
  pAVar2 = (pAVar1->meta).binaryExpr.right;
  op_00 = (pAVar1->meta).binaryExpr.op;
  pRVar3 = SetNodeValue(runner,(pAVar1->meta).binaryExpr.left);
  runner->currentNode = pAVar2;
  right_00 = RunStatement(runner);
  pRVar3 = RunMathContexts(pRVar3,right_00,op_00);
  return pRVar3;
}

Assistant:

RunnerContext* RunBinary(Runner* runner){
  DEBUG_PRINT_RUNNER("Binary expression")
  ASTNode* binary = runner->currentNode;
  ASTNode* left = GET_BIN_LEFT(binary);
  ASTNode* right = GET_BIN_RIGHT(binary);
  Token op = GET_BIN_OP(binary);

  RunnerContext* leftContext = SetNodeValue(runner, left);
  runner->currentNode = right;
  RunnerContext* rightContext = RunStatement(runner);

  return RunMathContexts(leftContext, rightContext, op);
}